

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct64_low32_ssse3(__m128i *input,__m128i *output)

{
  undefined1 (*pauVar1) [16];
  __m128i __rounding_00;
  __m128i __rounding_01;
  __m128i __rounding_02;
  __m128i __rounding_03;
  __m128i __rounding_04;
  __m128i __rounding_05;
  __m128i __rounding_06;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined2 uVar80;
  short sVar81;
  undefined4 uVar82;
  uint uVar83;
  int iVar84;
  uint uVar85;
  int32_t *piVar86;
  undefined1 (*in_RDI) [16];
  int iVar87;
  int iVar88;
  int iVar141;
  int iVar142;
  int iVar143;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  int iVar144;
  int iVar145;
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i _in1_39;
  __m128i _in0_39;
  __m128i _in1_38;
  __m128i _in0_38;
  __m128i _in1_37;
  __m128i _in0_37;
  __m128i _in1_36;
  __m128i _in0_36;
  __m128i _in1_35;
  __m128i _in0_35;
  __m128i _in1_34;
  __m128i _in0_34;
  __m128i _in1_33;
  __m128i _in0_33;
  __m128i _in1_32;
  __m128i _in0_32;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i _in1_31;
  __m128i _in0_31;
  __m128i _in1_30;
  __m128i _in0_30;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i _in1_29;
  __m128i _in0_29;
  __m128i _in1_28;
  __m128i _in0_28;
  __m128i _in_31;
  __m128i _w1_31;
  __m128i _w0_31;
  __m128i _in_30;
  __m128i _w1_30;
  __m128i _w0_30;
  __m128i _in1_27;
  __m128i _in0_27;
  __m128i _in1_26;
  __m128i _in0_26;
  __m128i _in1_25;
  __m128i _in0_25;
  __m128i _in1_24;
  __m128i _in0_24;
  __m128i _in_29;
  __m128i _w1_29;
  __m128i _w0_29;
  __m128i _in_28;
  __m128i _w1_28;
  __m128i _w0_28;
  __m128i _in1_23;
  __m128i _in0_23;
  __m128i _in1_22;
  __m128i _in0_22;
  __m128i _in1_21;
  __m128i _in0_21;
  __m128i _in1_20;
  __m128i _in0_20;
  __m128i _in1_19;
  __m128i _in0_19;
  __m128i _in1_18;
  __m128i _in0_18;
  __m128i _in1_17;
  __m128i _in0_17;
  __m128i _in1_16;
  __m128i _in0_16;
  __m128i _in_27;
  __m128i _w1_27;
  __m128i _w0_27;
  __m128i _in_26;
  __m128i _w1_26;
  __m128i _w0_26;
  __m128i _in_25;
  __m128i _w1_25;
  __m128i _w0_25;
  __m128i _in_24;
  __m128i _w1_24;
  __m128i _w0_24;
  __m128i _in1_15;
  __m128i _in0_15;
  __m128i _in1_14;
  __m128i _in0_14;
  __m128i _in1_13;
  __m128i _in0_13;
  __m128i _in1_12;
  __m128i _in0_12;
  __m128i _in1_11;
  __m128i _in0_11;
  __m128i _in1_10;
  __m128i _in0_10;
  __m128i _in1_9;
  __m128i _in0_9;
  __m128i _in1_8;
  __m128i _in0_8;
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i _in_23;
  __m128i _w1_23;
  __m128i _w0_23;
  __m128i _in_22;
  __m128i _w1_22;
  __m128i _w0_22;
  __m128i _in_21;
  __m128i _w1_21;
  __m128i _w0_21;
  __m128i _in_20;
  __m128i _w1_20;
  __m128i _w0_20;
  __m128i _in_19;
  __m128i _w1_19;
  __m128i _w0_19;
  __m128i _in_18;
  __m128i _w1_18;
  __m128i _w0_18;
  __m128i _in_17;
  __m128i _w1_17;
  __m128i _w0_17;
  __m128i _in_16;
  __m128i _w1_16;
  __m128i _w0_16;
  __m128i _in_15;
  __m128i _w1_15;
  __m128i _w0_15;
  __m128i _in_14;
  __m128i _w1_14;
  __m128i _w0_14;
  __m128i _in_13;
  __m128i _w1_13;
  __m128i _w0_13;
  __m128i _in_12;
  __m128i _w1_12;
  __m128i _w0_12;
  __m128i _in_11;
  __m128i _w1_11;
  __m128i _w0_11;
  __m128i _in_10;
  __m128i _w1_10;
  __m128i _w0_10;
  __m128i _in_9;
  __m128i _w1_9;
  __m128i _w0_9;
  __m128i _in_8;
  __m128i _w1_8;
  __m128i _w0_8;
  __m128i _in_7;
  __m128i _w1_7;
  __m128i _w0_7;
  __m128i _in_6;
  __m128i _w1_6;
  __m128i _w0_6;
  __m128i _in_5;
  __m128i _w1_5;
  __m128i _w0_5;
  __m128i _in_4;
  __m128i _w1_4;
  __m128i _w0_4;
  __m128i _in_3;
  __m128i _w1_3;
  __m128i _w0_3;
  __m128i _in_2;
  __m128i _w1_2;
  __m128i _w0_2;
  __m128i _in_1;
  __m128i _w1_1;
  __m128i _w0_1;
  __m128i _in;
  __m128i _w1;
  __m128i _w0;
  __m128i x [64];
  __m128i cospi_m32_p32;
  __m128i cospi_m48_m16;
  __m128i cospi_p48_p16;
  __m128i cospi_m16_p48;
  __m128i cospi_p32_p32;
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  int8_t in_stack_ffffffffffffc73f;
  longlong in_stack_ffffffffffffc740;
  longlong in_stack_ffffffffffffc748;
  int32_t *in_stack_ffffffffffffc750;
  __m128i *in_stack_ffffffffffffc758;
  undefined1 uStack_3492;
  int8_t iVar146;
  undefined4 in_stack_ffffffffffffcb9c;
  undefined4 in_stack_ffffffffffffcba0;
  undefined4 in_stack_ffffffffffffcba4;
  undefined4 in_stack_ffffffffffffcba8;
  undefined4 in_stack_ffffffffffffcbac;
  undefined4 in_stack_ffffffffffffcbb8;
  undefined4 in_stack_ffffffffffffcbbc;
  undefined4 in_stack_ffffffffffffcbc0;
  undefined4 in_stack_ffffffffffffcbc4;
  undefined8 in_stack_ffffffffffffcd78;
  int8_t cos_bit_00;
  longlong in_stack_ffffffffffffcd80;
  longlong in_stack_ffffffffffffcd88;
  int32_t *in_stack_ffffffffffffcd90;
  __m128i *in_stack_ffffffffffffcd98;
  int8_t cos_bit_01;
  longlong lVar147;
  longlong lVar148;
  int32_t *cospi_00;
  __m128i *x_00;
  int32_t *local_2998;
  __m128i *palStack_2990;
  int8_t iStack_2981;
  longlong lStack_2980;
  longlong local_2978;
  __m128i *local_2828;
  longlong local_2818;
  int32_t *piStack_2810;
  int8_t iStack_27f1;
  longlong lStack_27f0;
  undefined2 local_1cc8;
  undefined2 uStack_1cc6;
  undefined2 uStack_1cc4;
  undefined2 uStack_1cc2;
  undefined2 local_1cb8;
  undefined2 uStack_1cb6;
  undefined2 uStack_1cb4;
  undefined2 uStack_1cb2;
  undefined2 local_1ca8;
  undefined2 uStack_1ca6;
  undefined2 uStack_1ca4;
  undefined2 uStack_1ca2;
  undefined2 local_1c98;
  undefined2 uStack_1c96;
  undefined2 uStack_1c94;
  undefined2 uStack_1c92;
  undefined2 local_1c88;
  undefined2 uStack_1c86;
  undefined2 uStack_1c84;
  undefined2 uStack_1c82;
  undefined2 local_1c78;
  undefined2 uStack_1c76;
  undefined2 uStack_1c74;
  undefined2 uStack_1c72;
  undefined2 local_1c68;
  undefined2 uStack_1c64;
  undefined2 uStack_1c62;
  undefined2 local_1c58;
  undefined2 uStack_1c56;
  undefined2 uStack_1c54;
  undefined2 uStack_1c52;
  undefined2 local_1c48;
  undefined2 uStack_1c46;
  undefined2 uStack_1c44;
  undefined2 uStack_1c42;
  undefined2 local_1c38;
  undefined2 uStack_1c36;
  undefined2 uStack_1c34;
  undefined2 uStack_1c32;
  undefined2 uStack_1c20;
  undefined2 uStack_1c1e;
  undefined2 uStack_1c1c;
  undefined2 uStack_1c1a;
  undefined2 uStack_1c10;
  undefined2 uStack_1c0e;
  undefined2 uStack_1c0c;
  undefined2 uStack_1c0a;
  undefined2 uStack_1c00;
  undefined2 uStack_1bfe;
  undefined2 uStack_1bfc;
  undefined2 uStack_1bfa;
  undefined2 uStack_1bf0;
  undefined2 uStack_1bee;
  undefined2 uStack_1bec;
  undefined2 uStack_1bea;
  undefined2 uStack_1be0;
  undefined2 uStack_1bde;
  undefined2 uStack_1bdc;
  undefined2 uStack_1bda;
  undefined2 uStack_1bd0;
  undefined2 uStack_1bce;
  undefined2 uStack_1bcc;
  undefined2 uStack_1bca;
  undefined2 uStack_1bc0;
  undefined2 uStack_1bbe;
  undefined2 uStack_1bbc;
  undefined2 uStack_1bba;
  undefined2 uStack_1bb0;
  undefined2 uStack_1bae;
  undefined2 uStack_1bac;
  undefined2 uStack_1baa;
  undefined2 uStack_1ba0;
  undefined2 uStack_1b9e;
  undefined2 uStack_1b9c;
  undefined2 uStack_1b9a;
  undefined2 uStack_1b90;
  undefined2 uStack_1b8e;
  undefined2 uStack_1b8c;
  undefined2 uStack_1b8a;
  int local_18f8;
  int iStack_18f4;
  int iStack_18f0;
  int iStack_18ec;
  int local_18d8;
  int iStack_18d4;
  int iStack_18d0;
  int iStack_18cc;
  int local_18b8;
  int iStack_18b4;
  int iStack_18b0;
  int iStack_18ac;
  int local_1898;
  int iStack_1894;
  int iStack_1890;
  int iStack_188c;
  int local_1878;
  int iStack_1874;
  int iStack_1870;
  int iStack_186c;
  int local_1858;
  int iStack_1854;
  int iStack_1850;
  int iStack_184c;
  int local_1838;
  int iStack_1834;
  int iStack_1830;
  int iStack_182c;
  int local_1818;
  int iStack_1814;
  int iStack_1810;
  int iStack_180c;
  int local_17f8;
  int iStack_17f4;
  int iStack_17f0;
  int iStack_17ec;
  int local_17d8;
  int iStack_17d4;
  int iStack_17d0;
  int iStack_17cc;
  int local_17b8;
  int iStack_17b4;
  int iStack_17b0;
  int iStack_17ac;
  int local_1798;
  int iStack_1794;
  int iStack_1790;
  int iStack_178c;
  int local_1778;
  int iStack_1774;
  int iStack_1770;
  int iStack_176c;
  int local_1758;
  int iStack_1754;
  int iStack_1750;
  int iStack_174c;
  int local_1738;
  int iStack_1734;
  int iStack_1730;
  int iStack_172c;
  int local_1718;
  int iStack_1714;
  int iStack_1710;
  int iStack_170c;
  int local_16f8;
  int iStack_16f4;
  int iStack_16f0;
  int iStack_16ec;
  int local_16d8;
  int iStack_16d4;
  int iStack_16d0;
  int iStack_16cc;
  int local_16b8;
  int iStack_16b4;
  int iStack_16b0;
  int iStack_16ac;
  int local_1698;
  int iStack_1694;
  int iStack_1690;
  int iStack_168c;
  
  iVar146 = (int8_t)((uint)in_stack_ffffffffffffcb9c >> 0x18);
  cos_bit_00 = (int8_t)((ulong)in_stack_ffffffffffffcd78 >> 0x38);
  piVar86 = cospi_arr(0xc);
  uVar82 = CONCAT22((short)piVar86[0x20],(short)piVar86[0x20]);
  uVar74 = CONCAT44(uVar82,uVar82);
  uVar75 = CONCAT44(uVar82,uVar82);
  uVar83 = -piVar86[0x10] & 0xffffU | piVar86[0x30] << 0x10;
  uVar76 = CONCAT44(uVar83,uVar83);
  uVar77 = CONCAT44(uVar83,uVar83);
  uVar83 = (uint)*(ushort *)(piVar86 + 0x30) | piVar86[0x10] << 0x10;
  iVar84 = (-piVar86[0x30] & 0xffffU) + piVar86[0x10] * -0x10000;
  uVar85 = -piVar86[0x20] & 0xffffU | piVar86[0x20] << 0x10;
  uVar78 = CONCAT44(uVar85,uVar85);
  uVar79 = CONCAT44(uVar85,uVar85);
  auVar15 = *in_RDI;
  auVar14 = *in_RDI;
  auVar17 = in_RDI[0x10];
  auVar16 = in_RDI[0x10];
  auVar139 = in_RDI[8];
  auVar140 = in_RDI[8];
  auVar137 = in_RDI[0x18];
  auVar138 = in_RDI[0x18];
  pauVar1 = in_RDI + 0xc;
  cos_bit_01 = (int8_t)((ulong)*(undefined8 *)*pauVar1 >> 0x38);
  lVar147 = *(longlong *)(in_RDI[0xc] + 8);
  uVar80 = (undefined2)(piVar86[0x3f] << 3);
  auVar13._2_2_ = uVar80;
  auVar13._0_2_ = uVar80;
  auVar13._4_2_ = uVar80;
  auVar13._6_2_ = uVar80;
  auVar13._10_2_ = uVar80;
  auVar13._8_2_ = uVar80;
  auVar13._12_2_ = uVar80;
  auVar13._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[1] << 3);
  auVar12._2_2_ = uVar80;
  auVar12._0_2_ = uVar80;
  auVar12._4_2_ = uVar80;
  auVar12._6_2_ = uVar80;
  auVar12._10_2_ = uVar80;
  auVar12._8_2_ = uVar80;
  auVar12._12_2_ = uVar80;
  auVar12._14_2_ = uVar80;
  auVar89 = pmulhrsw(in_RDI[1],auVar13);
  auVar90 = pmulhrsw(in_RDI[1],auVar12);
  sVar81 = (short)piVar86[0x21] * -8;
  auVar11._2_2_ = sVar81;
  auVar11._0_2_ = sVar81;
  auVar11._4_2_ = sVar81;
  auVar11._6_2_ = sVar81;
  auVar11._10_2_ = sVar81;
  auVar11._8_2_ = sVar81;
  auVar11._12_2_ = sVar81;
  auVar11._14_2_ = sVar81;
  uVar80 = (undefined2)(piVar86[0x1f] << 3);
  auVar10._2_2_ = uVar80;
  auVar10._0_2_ = uVar80;
  auVar10._4_2_ = uVar80;
  auVar10._6_2_ = uVar80;
  auVar10._10_2_ = uVar80;
  auVar10._8_2_ = uVar80;
  auVar10._12_2_ = uVar80;
  auVar10._14_2_ = uVar80;
  auVar91 = pmulhrsw(in_RDI[0x1f],auVar11);
  auVar92 = pmulhrsw(in_RDI[0x1f],auVar10);
  uVar80 = (undefined2)(piVar86[0x2f] << 3);
  auVar9._2_2_ = uVar80;
  auVar9._0_2_ = uVar80;
  auVar9._4_2_ = uVar80;
  auVar9._6_2_ = uVar80;
  auVar9._10_2_ = uVar80;
  auVar9._8_2_ = uVar80;
  auVar9._12_2_ = uVar80;
  auVar9._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[0x11] << 3);
  auVar8._2_2_ = uVar80;
  auVar8._0_2_ = uVar80;
  auVar8._4_2_ = uVar80;
  auVar8._6_2_ = uVar80;
  auVar8._10_2_ = uVar80;
  auVar8._8_2_ = uVar80;
  auVar8._12_2_ = uVar80;
  auVar8._14_2_ = uVar80;
  auVar93 = pmulhrsw(in_RDI[0x11],auVar9);
  auVar94 = pmulhrsw(in_RDI[0x11],auVar8);
  sVar81 = (short)piVar86[0x31] * -8;
  auVar7._2_2_ = sVar81;
  auVar7._0_2_ = sVar81;
  auVar7._4_2_ = sVar81;
  auVar7._6_2_ = sVar81;
  auVar7._10_2_ = sVar81;
  auVar7._8_2_ = sVar81;
  auVar7._12_2_ = sVar81;
  auVar7._14_2_ = sVar81;
  uVar80 = (undefined2)(piVar86[0xf] << 3);
  auVar6._2_2_ = uVar80;
  auVar6._0_2_ = uVar80;
  auVar6._4_2_ = uVar80;
  auVar6._6_2_ = uVar80;
  auVar6._10_2_ = uVar80;
  auVar6._8_2_ = uVar80;
  auVar6._12_2_ = uVar80;
  auVar6._14_2_ = uVar80;
  auVar95 = pmulhrsw(in_RDI[0xf],auVar7);
  auVar96 = pmulhrsw(in_RDI[0xf],auVar6);
  uVar80 = (undefined2)(piVar86[0x37] << 3);
  auVar5._2_2_ = uVar80;
  auVar5._0_2_ = uVar80;
  auVar5._4_2_ = uVar80;
  auVar5._6_2_ = uVar80;
  auVar5._10_2_ = uVar80;
  auVar5._8_2_ = uVar80;
  auVar5._12_2_ = uVar80;
  auVar5._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[9] << 3);
  auVar4._2_2_ = uVar80;
  auVar4._0_2_ = uVar80;
  auVar4._4_2_ = uVar80;
  auVar4._6_2_ = uVar80;
  auVar4._10_2_ = uVar80;
  auVar4._8_2_ = uVar80;
  auVar4._12_2_ = uVar80;
  auVar4._14_2_ = uVar80;
  auVar97 = pmulhrsw(in_RDI[9],auVar5);
  auVar98 = pmulhrsw(in_RDI[9],auVar4);
  sVar81 = (short)piVar86[0x29] * -8;
  auVar3._2_2_ = sVar81;
  auVar3._0_2_ = sVar81;
  auVar3._4_2_ = sVar81;
  auVar3._6_2_ = sVar81;
  auVar3._10_2_ = sVar81;
  auVar3._8_2_ = sVar81;
  auVar3._12_2_ = sVar81;
  auVar3._14_2_ = sVar81;
  uVar80 = (undefined2)(piVar86[0x17] << 3);
  auVar2._2_2_ = uVar80;
  auVar2._0_2_ = uVar80;
  auVar2._4_2_ = uVar80;
  auVar2._6_2_ = uVar80;
  auVar2._10_2_ = uVar80;
  auVar2._8_2_ = uVar80;
  auVar2._12_2_ = uVar80;
  auVar2._14_2_ = uVar80;
  auVar99 = pmulhrsw(in_RDI[0x17],auVar3);
  auVar100 = pmulhrsw(in_RDI[0x17],auVar2);
  uVar80 = (undefined2)(piVar86[0x27] << 3);
  auVar101._2_2_ = uVar80;
  auVar101._0_2_ = uVar80;
  auVar101._4_2_ = uVar80;
  auVar101._6_2_ = uVar80;
  auVar101._10_2_ = uVar80;
  auVar101._8_2_ = uVar80;
  auVar101._12_2_ = uVar80;
  auVar101._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[0x19] << 3);
  auVar102._2_2_ = uVar80;
  auVar102._0_2_ = uVar80;
  auVar102._4_2_ = uVar80;
  auVar102._6_2_ = uVar80;
  auVar102._10_2_ = uVar80;
  auVar102._8_2_ = uVar80;
  auVar102._12_2_ = uVar80;
  auVar102._14_2_ = uVar80;
  auVar101 = pmulhrsw(in_RDI[0x19],auVar101);
  auVar102 = pmulhrsw(in_RDI[0x19],auVar102);
  sVar81 = (short)piVar86[0x39] * -8;
  auVar103._2_2_ = sVar81;
  auVar103._0_2_ = sVar81;
  auVar103._4_2_ = sVar81;
  auVar103._6_2_ = sVar81;
  auVar103._10_2_ = sVar81;
  auVar103._8_2_ = sVar81;
  auVar103._12_2_ = sVar81;
  auVar103._14_2_ = sVar81;
  uVar80 = (undefined2)(piVar86[7] << 3);
  auVar104._2_2_ = uVar80;
  auVar104._0_2_ = uVar80;
  auVar104._4_2_ = uVar80;
  auVar104._6_2_ = uVar80;
  auVar104._10_2_ = uVar80;
  auVar104._8_2_ = uVar80;
  auVar104._12_2_ = uVar80;
  auVar104._14_2_ = uVar80;
  auVar103 = pmulhrsw(in_RDI[7],auVar103);
  auVar104 = pmulhrsw(in_RDI[7],auVar104);
  uVar80 = (undefined2)(piVar86[0x3b] << 3);
  auVar105._2_2_ = uVar80;
  auVar105._0_2_ = uVar80;
  auVar105._4_2_ = uVar80;
  auVar105._6_2_ = uVar80;
  auVar105._10_2_ = uVar80;
  auVar105._8_2_ = uVar80;
  auVar105._12_2_ = uVar80;
  auVar105._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[5] << 3);
  auVar106._2_2_ = uVar80;
  auVar106._0_2_ = uVar80;
  auVar106._4_2_ = uVar80;
  auVar106._6_2_ = uVar80;
  auVar106._10_2_ = uVar80;
  auVar106._8_2_ = uVar80;
  auVar106._12_2_ = uVar80;
  auVar106._14_2_ = uVar80;
  auVar105 = pmulhrsw(in_RDI[5],auVar105);
  auVar106 = pmulhrsw(in_RDI[5],auVar106);
  sVar81 = (short)piVar86[0x25] * -8;
  auVar107._2_2_ = sVar81;
  auVar107._0_2_ = sVar81;
  auVar107._4_2_ = sVar81;
  auVar107._6_2_ = sVar81;
  auVar107._10_2_ = sVar81;
  auVar107._8_2_ = sVar81;
  auVar107._12_2_ = sVar81;
  auVar107._14_2_ = sVar81;
  uVar80 = (undefined2)(piVar86[0x1b] << 3);
  auVar108._2_2_ = uVar80;
  auVar108._0_2_ = uVar80;
  auVar108._4_2_ = uVar80;
  auVar108._6_2_ = uVar80;
  auVar108._10_2_ = uVar80;
  auVar108._8_2_ = uVar80;
  auVar108._12_2_ = uVar80;
  auVar108._14_2_ = uVar80;
  auVar107 = pmulhrsw(in_RDI[0x1b],auVar107);
  auVar108 = pmulhrsw(in_RDI[0x1b],auVar108);
  uVar80 = (undefined2)(piVar86[0x2b] << 3);
  auVar109._2_2_ = uVar80;
  auVar109._0_2_ = uVar80;
  auVar109._4_2_ = uVar80;
  auVar109._6_2_ = uVar80;
  auVar109._10_2_ = uVar80;
  auVar109._8_2_ = uVar80;
  auVar109._12_2_ = uVar80;
  auVar109._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[0x15] << 3);
  auVar110._2_2_ = uVar80;
  auVar110._0_2_ = uVar80;
  auVar110._4_2_ = uVar80;
  auVar110._6_2_ = uVar80;
  auVar110._10_2_ = uVar80;
  auVar110._8_2_ = uVar80;
  auVar110._12_2_ = uVar80;
  auVar110._14_2_ = uVar80;
  auVar109 = pmulhrsw(in_RDI[0x15],auVar109);
  auVar110 = pmulhrsw(in_RDI[0x15],auVar110);
  sVar81 = (short)piVar86[0x35] * -8;
  auVar111._2_2_ = sVar81;
  auVar111._0_2_ = sVar81;
  auVar111._4_2_ = sVar81;
  auVar111._6_2_ = sVar81;
  auVar111._10_2_ = sVar81;
  auVar111._8_2_ = sVar81;
  auVar111._12_2_ = sVar81;
  auVar111._14_2_ = sVar81;
  uVar80 = (undefined2)(piVar86[0xb] << 3);
  auVar112._2_2_ = uVar80;
  auVar112._0_2_ = uVar80;
  auVar112._4_2_ = uVar80;
  auVar112._6_2_ = uVar80;
  auVar112._10_2_ = uVar80;
  auVar112._8_2_ = uVar80;
  auVar112._12_2_ = uVar80;
  auVar112._14_2_ = uVar80;
  auVar111 = pmulhrsw(in_RDI[0xb],auVar111);
  auVar112 = pmulhrsw(in_RDI[0xb],auVar112);
  uVar80 = (undefined2)(piVar86[0x33] << 3);
  auVar113._2_2_ = uVar80;
  auVar113._0_2_ = uVar80;
  auVar113._4_2_ = uVar80;
  auVar113._6_2_ = uVar80;
  auVar113._10_2_ = uVar80;
  auVar113._8_2_ = uVar80;
  auVar113._12_2_ = uVar80;
  auVar113._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[0xd] << 3);
  auVar114._2_2_ = uVar80;
  auVar114._0_2_ = uVar80;
  auVar114._4_2_ = uVar80;
  auVar114._6_2_ = uVar80;
  auVar114._10_2_ = uVar80;
  auVar114._8_2_ = uVar80;
  auVar114._12_2_ = uVar80;
  auVar114._14_2_ = uVar80;
  auVar113 = pmulhrsw(in_RDI[0xd],auVar113);
  auVar114 = pmulhrsw(in_RDI[0xd],auVar114);
  sVar81 = (short)piVar86[0x2d] * -8;
  auVar115._2_2_ = sVar81;
  auVar115._0_2_ = sVar81;
  auVar115._4_2_ = sVar81;
  auVar115._6_2_ = sVar81;
  auVar115._10_2_ = sVar81;
  auVar115._8_2_ = sVar81;
  auVar115._12_2_ = sVar81;
  auVar115._14_2_ = sVar81;
  uVar80 = (undefined2)(piVar86[0x13] << 3);
  auVar116._2_2_ = uVar80;
  auVar116._0_2_ = uVar80;
  auVar116._4_2_ = uVar80;
  auVar116._6_2_ = uVar80;
  auVar116._10_2_ = uVar80;
  auVar116._8_2_ = uVar80;
  auVar116._12_2_ = uVar80;
  auVar116._14_2_ = uVar80;
  auVar115 = pmulhrsw(in_RDI[0x13],auVar115);
  auVar116 = pmulhrsw(in_RDI[0x13],auVar116);
  uVar80 = (undefined2)(piVar86[0x23] << 3);
  auVar117._2_2_ = uVar80;
  auVar117._0_2_ = uVar80;
  auVar117._4_2_ = uVar80;
  auVar117._6_2_ = uVar80;
  auVar117._10_2_ = uVar80;
  auVar117._8_2_ = uVar80;
  auVar117._12_2_ = uVar80;
  auVar117._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[0x1d] << 3);
  auVar118._2_2_ = uVar80;
  auVar118._0_2_ = uVar80;
  auVar118._4_2_ = uVar80;
  auVar118._6_2_ = uVar80;
  auVar118._10_2_ = uVar80;
  auVar118._8_2_ = uVar80;
  auVar118._12_2_ = uVar80;
  auVar118._14_2_ = uVar80;
  auVar117 = pmulhrsw(in_RDI[0x1d],auVar117);
  auVar118 = pmulhrsw(in_RDI[0x1d],auVar118);
  sVar81 = (short)piVar86[0x3d] * -8;
  auVar119._2_2_ = sVar81;
  auVar119._0_2_ = sVar81;
  auVar119._4_2_ = sVar81;
  auVar119._6_2_ = sVar81;
  auVar119._10_2_ = sVar81;
  auVar119._8_2_ = sVar81;
  auVar119._12_2_ = sVar81;
  auVar119._14_2_ = sVar81;
  uVar80 = (undefined2)(piVar86[3] << 3);
  auVar120._2_2_ = uVar80;
  auVar120._0_2_ = uVar80;
  auVar120._4_2_ = uVar80;
  auVar120._6_2_ = uVar80;
  auVar120._10_2_ = uVar80;
  auVar120._8_2_ = uVar80;
  auVar120._12_2_ = uVar80;
  auVar120._14_2_ = uVar80;
  auVar119 = pmulhrsw(in_RDI[3],auVar119);
  auVar120 = pmulhrsw(in_RDI[3],auVar120);
  uVar80 = (undefined2)(piVar86[0x3e] << 3);
  auVar121._2_2_ = uVar80;
  auVar121._0_2_ = uVar80;
  auVar121._4_2_ = uVar80;
  auVar121._6_2_ = uVar80;
  auVar121._10_2_ = uVar80;
  auVar121._8_2_ = uVar80;
  auVar121._12_2_ = uVar80;
  auVar121._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[2] << 3);
  auVar122._2_2_ = uVar80;
  auVar122._0_2_ = uVar80;
  auVar122._4_2_ = uVar80;
  auVar122._6_2_ = uVar80;
  auVar122._10_2_ = uVar80;
  auVar122._8_2_ = uVar80;
  auVar122._12_2_ = uVar80;
  auVar122._14_2_ = uVar80;
  auVar121 = pmulhrsw(in_RDI[2],auVar121);
  auVar122 = pmulhrsw(in_RDI[2],auVar122);
  sVar81 = (short)piVar86[0x22] * -8;
  auVar123._2_2_ = sVar81;
  auVar123._0_2_ = sVar81;
  auVar123._4_2_ = sVar81;
  auVar123._6_2_ = sVar81;
  auVar123._10_2_ = sVar81;
  auVar123._8_2_ = sVar81;
  auVar123._12_2_ = sVar81;
  auVar123._14_2_ = sVar81;
  uVar80 = (undefined2)(piVar86[0x1e] << 3);
  auVar124._2_2_ = uVar80;
  auVar124._0_2_ = uVar80;
  auVar124._4_2_ = uVar80;
  auVar124._6_2_ = uVar80;
  auVar124._10_2_ = uVar80;
  auVar124._8_2_ = uVar80;
  auVar124._12_2_ = uVar80;
  auVar124._14_2_ = uVar80;
  auVar123 = pmulhrsw(in_RDI[0x1e],auVar123);
  auVar124 = pmulhrsw(in_RDI[0x1e],auVar124);
  uVar80 = (undefined2)(piVar86[0x2e] << 3);
  auVar125._2_2_ = uVar80;
  auVar125._0_2_ = uVar80;
  auVar125._4_2_ = uVar80;
  auVar125._6_2_ = uVar80;
  auVar125._10_2_ = uVar80;
  auVar125._8_2_ = uVar80;
  auVar125._12_2_ = uVar80;
  auVar125._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[0x12] << 3);
  auVar126._2_2_ = uVar80;
  auVar126._0_2_ = uVar80;
  auVar126._4_2_ = uVar80;
  auVar126._6_2_ = uVar80;
  auVar126._10_2_ = uVar80;
  auVar126._8_2_ = uVar80;
  auVar126._12_2_ = uVar80;
  auVar126._14_2_ = uVar80;
  auVar125 = pmulhrsw(in_RDI[0x12],auVar125);
  auVar126 = pmulhrsw(in_RDI[0x12],auVar126);
  sVar81 = (short)piVar86[0x32] * -8;
  auVar127._2_2_ = sVar81;
  auVar127._0_2_ = sVar81;
  auVar127._4_2_ = sVar81;
  auVar127._6_2_ = sVar81;
  auVar127._10_2_ = sVar81;
  auVar127._8_2_ = sVar81;
  auVar127._12_2_ = sVar81;
  auVar127._14_2_ = sVar81;
  uVar80 = (undefined2)(piVar86[0xe] << 3);
  auVar128._2_2_ = uVar80;
  auVar128._0_2_ = uVar80;
  auVar128._4_2_ = uVar80;
  auVar128._6_2_ = uVar80;
  auVar128._10_2_ = uVar80;
  auVar128._8_2_ = uVar80;
  auVar128._12_2_ = uVar80;
  auVar128._14_2_ = uVar80;
  auVar127 = pmulhrsw(in_RDI[0xe],auVar127);
  auVar128 = pmulhrsw(in_RDI[0xe],auVar128);
  uVar80 = (undefined2)(piVar86[0x36] << 3);
  auVar129._2_2_ = uVar80;
  auVar129._0_2_ = uVar80;
  auVar129._4_2_ = uVar80;
  auVar129._6_2_ = uVar80;
  auVar129._10_2_ = uVar80;
  auVar129._8_2_ = uVar80;
  auVar129._12_2_ = uVar80;
  auVar129._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[10] << 3);
  auVar130._2_2_ = uVar80;
  auVar130._0_2_ = uVar80;
  auVar130._4_2_ = uVar80;
  auVar130._6_2_ = uVar80;
  auVar130._10_2_ = uVar80;
  auVar130._8_2_ = uVar80;
  auVar130._12_2_ = uVar80;
  auVar130._14_2_ = uVar80;
  auVar129 = pmulhrsw(in_RDI[10],auVar129);
  auVar130 = pmulhrsw(in_RDI[10],auVar130);
  sVar81 = (short)piVar86[0x2a] * -8;
  auVar131._2_2_ = sVar81;
  auVar131._0_2_ = sVar81;
  auVar131._4_2_ = sVar81;
  auVar131._6_2_ = sVar81;
  auVar131._10_2_ = sVar81;
  auVar131._8_2_ = sVar81;
  auVar131._12_2_ = sVar81;
  auVar131._14_2_ = sVar81;
  uVar80 = (undefined2)(piVar86[0x16] << 3);
  auVar132._2_2_ = uVar80;
  auVar132._0_2_ = uVar80;
  auVar132._4_2_ = uVar80;
  auVar132._6_2_ = uVar80;
  auVar132._10_2_ = uVar80;
  auVar132._8_2_ = uVar80;
  auVar132._12_2_ = uVar80;
  auVar132._14_2_ = uVar80;
  auVar131 = pmulhrsw(in_RDI[0x16],auVar131);
  auVar132 = pmulhrsw(in_RDI[0x16],auVar132);
  uVar80 = (undefined2)(piVar86[0x26] << 3);
  auVar133._2_2_ = uVar80;
  auVar133._0_2_ = uVar80;
  auVar133._4_2_ = uVar80;
  auVar133._6_2_ = uVar80;
  auVar133._10_2_ = uVar80;
  auVar133._8_2_ = uVar80;
  auVar133._12_2_ = uVar80;
  auVar133._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[0x1a] << 3);
  auVar134._2_2_ = uVar80;
  auVar134._0_2_ = uVar80;
  auVar134._4_2_ = uVar80;
  auVar134._6_2_ = uVar80;
  auVar134._10_2_ = uVar80;
  auVar134._8_2_ = uVar80;
  auVar134._12_2_ = uVar80;
  auVar134._14_2_ = uVar80;
  auVar133 = pmulhrsw(in_RDI[0x1a],auVar133);
  auVar134 = pmulhrsw(in_RDI[0x1a],auVar134);
  sVar81 = (short)piVar86[0x3a] * -8;
  auVar135._2_2_ = sVar81;
  auVar135._0_2_ = sVar81;
  auVar135._4_2_ = sVar81;
  auVar135._6_2_ = sVar81;
  auVar135._10_2_ = sVar81;
  auVar135._8_2_ = sVar81;
  auVar135._12_2_ = sVar81;
  auVar135._14_2_ = sVar81;
  uVar80 = (undefined2)(piVar86[6] << 3);
  auVar136._2_2_ = uVar80;
  auVar136._0_2_ = uVar80;
  auVar136._4_2_ = uVar80;
  auVar136._6_2_ = uVar80;
  auVar136._10_2_ = uVar80;
  auVar136._8_2_ = uVar80;
  auVar136._12_2_ = uVar80;
  auVar136._14_2_ = uVar80;
  auVar135 = pmulhrsw(in_RDI[6],auVar135);
  auVar136 = pmulhrsw(in_RDI[6],auVar136);
  paddsw(auVar89,auVar91);
  psubsw(auVar89,auVar91);
  psubsw(auVar95,auVar93);
  paddsw(auVar95,auVar93);
  paddsw(auVar97,auVar99);
  psubsw(auVar97,auVar99);
  psubsw(auVar103,auVar101);
  paddsw(auVar103,auVar101);
  paddsw(auVar105,auVar107);
  psubsw(auVar105,auVar107);
  psubsw(auVar111,auVar109);
  paddsw(auVar111,auVar109);
  paddsw(auVar113,auVar115);
  psubsw(auVar113,auVar115);
  psubsw(auVar119,auVar117);
  paddsw(auVar119,auVar117);
  paddsw(auVar120,auVar118);
  psubsw(auVar120,auVar118);
  psubsw(auVar114,auVar116);
  paddsw(auVar114,auVar116);
  paddsw(auVar112,auVar110);
  psubsw(auVar112,auVar110);
  psubsw(auVar106,auVar108);
  paddsw(auVar106,auVar108);
  paddsw(auVar104,auVar102);
  psubsw(auVar104,auVar102);
  psubsw(auVar98,auVar100);
  paddsw(auVar98,auVar100);
  paddsw(auVar96,auVar94);
  psubsw(auVar96,auVar94);
  psubsw(auVar90,auVar92);
  paddsw(auVar90,auVar92);
  uVar80 = (undefined2)(piVar86[0x3c] << 3);
  auVar100._2_2_ = uVar80;
  auVar100._0_2_ = uVar80;
  auVar100._4_2_ = uVar80;
  auVar100._6_2_ = uVar80;
  auVar100._10_2_ = uVar80;
  auVar100._8_2_ = uVar80;
  auVar100._12_2_ = uVar80;
  auVar100._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[4] << 3);
  auVar99._2_2_ = uVar80;
  auVar99._0_2_ = uVar80;
  auVar99._4_2_ = uVar80;
  auVar99._6_2_ = uVar80;
  auVar99._10_2_ = uVar80;
  auVar99._8_2_ = uVar80;
  auVar99._12_2_ = uVar80;
  auVar99._14_2_ = uVar80;
  auVar100 = pmulhrsw(in_RDI[4],auVar100);
  auVar99 = pmulhrsw(in_RDI[4],auVar99);
  sVar81 = (short)piVar86[0x24] * -8;
  auVar98._2_2_ = sVar81;
  auVar98._0_2_ = sVar81;
  auVar98._4_2_ = sVar81;
  auVar98._6_2_ = sVar81;
  auVar98._10_2_ = sVar81;
  auVar98._8_2_ = sVar81;
  auVar98._12_2_ = sVar81;
  auVar98._14_2_ = sVar81;
  uVar80 = (undefined2)(piVar86[0x1c] << 3);
  auVar97._2_2_ = uVar80;
  auVar97._0_2_ = uVar80;
  auVar97._4_2_ = uVar80;
  auVar97._6_2_ = uVar80;
  auVar97._10_2_ = uVar80;
  auVar97._8_2_ = uVar80;
  auVar97._12_2_ = uVar80;
  auVar97._14_2_ = uVar80;
  auVar98 = pmulhrsw(in_RDI[0x1c],auVar98);
  auVar97 = pmulhrsw(in_RDI[0x1c],auVar97);
  uVar80 = (undefined2)(piVar86[0x2c] << 3);
  auVar96._2_2_ = uVar80;
  auVar96._0_2_ = uVar80;
  auVar96._4_2_ = uVar80;
  auVar96._6_2_ = uVar80;
  auVar96._10_2_ = uVar80;
  auVar96._8_2_ = uVar80;
  auVar96._12_2_ = uVar80;
  auVar96._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[0x14] << 3);
  auVar95._2_2_ = uVar80;
  auVar95._0_2_ = uVar80;
  auVar95._4_2_ = uVar80;
  auVar95._6_2_ = uVar80;
  auVar95._10_2_ = uVar80;
  auVar95._8_2_ = uVar80;
  auVar95._12_2_ = uVar80;
  auVar95._14_2_ = uVar80;
  auVar96 = pmulhrsw(in_RDI[0x14],auVar96);
  auVar95 = pmulhrsw(in_RDI[0x14],auVar95);
  sVar81 = (short)piVar86[0x34] * -8;
  cospi_00 = (int32_t *)CONCAT26(sVar81,CONCAT24(sVar81,CONCAT22(sVar81,sVar81)));
  x_00 = (__m128i *)CONCAT26(sVar81,CONCAT24(sVar81,CONCAT22(sVar81,sVar81)));
  uVar80 = (undefined2)(piVar86[0xc] << 3);
  lVar148 = CONCAT26(uVar80,CONCAT24(uVar80,CONCAT22(uVar80,uVar80)));
  auVar93._10_2_ = uVar80;
  auVar93._8_2_ = uVar80;
  auVar93._12_2_ = uVar80;
  auVar93._14_2_ = uVar80;
  auVar94._8_8_ = x_00;
  auVar94._0_8_ = cospi_00;
  auVar94 = pmulhrsw(*pauVar1,auVar94);
  auVar93._0_8_ = lVar148;
  auVar93 = pmulhrsw(*pauVar1,auVar93);
  paddsw(auVar121,auVar123);
  psubsw(auVar121,auVar123);
  psubsw(auVar127,auVar125);
  paddsw(auVar127,auVar125);
  paddsw(auVar129,auVar131);
  psubsw(auVar129,auVar131);
  psubsw(auVar135,auVar133);
  paddsw(auVar135,auVar133);
  paddsw(auVar136,auVar134);
  psubsw(auVar136,auVar134);
  psubsw(auVar130,auVar132);
  paddsw(auVar130,auVar132);
  local_2828 = auVar128._0_8_;
  local_2818 = auVar126._0_8_;
  piStack_2810 = auVar126._8_8_;
  paddsw(auVar128,auVar126);
  psubsw(auVar128,auVar126);
  iStack_27f1 = auVar122[7];
  lStack_27f0 = auVar122._8_8_;
  psubsw(auVar122,auVar124);
  paddsw(auVar122,auVar124);
  __rounding_04[1] = in_stack_ffffffffffffcd88;
  __rounding_04[0] = in_stack_ffffffffffffcd80;
  idct64_stage4_high32_sse2
            (in_stack_ffffffffffffcd98,in_stack_ffffffffffffcd90,__rounding_04,cos_bit_00);
  uVar80 = (undefined2)(piVar86[0x38] << 3);
  auVar92._2_2_ = uVar80;
  auVar92._0_2_ = uVar80;
  auVar92._4_2_ = uVar80;
  auVar92._6_2_ = uVar80;
  auVar92._10_2_ = uVar80;
  auVar92._8_2_ = uVar80;
  auVar92._12_2_ = uVar80;
  auVar92._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[8] << 3);
  auVar91._2_2_ = uVar80;
  auVar91._0_2_ = uVar80;
  auVar91._4_2_ = uVar80;
  auVar91._6_2_ = uVar80;
  auVar91._10_2_ = uVar80;
  auVar91._8_2_ = uVar80;
  auVar91._12_2_ = uVar80;
  auVar91._14_2_ = uVar80;
  auVar92 = pmulhrsw(auVar140,auVar92);
  auVar91 = pmulhrsw(auVar139,auVar91);
  sVar81 = (short)piVar86[0x28] * -8;
  auVar90._2_2_ = sVar81;
  auVar90._0_2_ = sVar81;
  auVar90._4_2_ = sVar81;
  auVar90._6_2_ = sVar81;
  auVar90._10_2_ = sVar81;
  auVar90._8_2_ = sVar81;
  auVar90._12_2_ = sVar81;
  auVar90._14_2_ = sVar81;
  uVar80 = (undefined2)(piVar86[0x18] << 3);
  auVar89._2_2_ = uVar80;
  auVar89._0_2_ = uVar80;
  auVar89._4_2_ = uVar80;
  auVar89._6_2_ = uVar80;
  auVar89._10_2_ = uVar80;
  auVar89._8_2_ = uVar80;
  auVar89._12_2_ = uVar80;
  auVar89._14_2_ = uVar80;
  auVar90 = pmulhrsw(auVar138,auVar90);
  auVar89 = pmulhrsw(auVar137,auVar89);
  auVar136 = paddsw(auVar100,auVar98);
  auVar98 = psubsw(auVar100,auVar98);
  auVar100 = psubsw(auVar94,auVar96);
  auVar94 = paddsw(auVar94,auVar96);
  auVar96 = paddsw(auVar93,auVar95);
  auVar93 = psubsw(auVar93,auVar95);
  auVar95 = psubsw(auVar99,auVar97);
  auVar97 = paddsw(auVar99,auVar97);
  __rounding_02[0]._4_4_ = in_stack_ffffffffffffcba4;
  __rounding_02[0]._0_4_ = in_stack_ffffffffffffcba0;
  __rounding_02[1]._0_4_ = in_stack_ffffffffffffcba8;
  __rounding_02[1]._4_4_ = in_stack_ffffffffffffcbac;
  idct64_stage5_high48_sse2
            ((__m128i *)CONCAT44(in_stack_ffffffffffffcbc4,in_stack_ffffffffffffcbc0),
             (int32_t *)CONCAT44(in_stack_ffffffffffffcbbc,in_stack_ffffffffffffcbb8),__rounding_02,
             iVar146);
  uVar80 = (undefined2)(piVar86[0x20] << 3);
  auVar137._2_2_ = uVar80;
  auVar137._0_2_ = uVar80;
  auVar137._4_2_ = uVar80;
  auVar137._6_2_ = uVar80;
  auVar137._10_2_ = uVar80;
  auVar137._8_2_ = uVar80;
  auVar137._12_2_ = uVar80;
  auVar137._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[0x20] << 3);
  auVar138._2_2_ = uVar80;
  auVar138._0_2_ = uVar80;
  auVar138._4_2_ = uVar80;
  auVar138._6_2_ = uVar80;
  auVar138._10_2_ = uVar80;
  auVar138._8_2_ = uVar80;
  auVar138._12_2_ = uVar80;
  auVar138._14_2_ = uVar80;
  auVar137 = pmulhrsw(auVar14,auVar137);
  auVar138 = pmulhrsw(auVar15,auVar138);
  uVar80 = (undefined2)(piVar86[0x30] << 3);
  auVar139._2_2_ = uVar80;
  auVar139._0_2_ = uVar80;
  auVar139._4_2_ = uVar80;
  auVar139._6_2_ = uVar80;
  auVar139._10_2_ = uVar80;
  auVar139._8_2_ = uVar80;
  auVar139._12_2_ = uVar80;
  auVar139._14_2_ = uVar80;
  uVar80 = (undefined2)(piVar86[0x10] << 3);
  auVar140._2_2_ = uVar80;
  auVar140._0_2_ = uVar80;
  auVar140._4_2_ = uVar80;
  auVar140._6_2_ = uVar80;
  auVar140._10_2_ = uVar80;
  auVar140._8_2_ = uVar80;
  auVar140._12_2_ = uVar80;
  auVar140._14_2_ = uVar80;
  auVar139 = pmulhrsw(auVar16,auVar139);
  auVar140 = pmulhrsw(auVar17,auVar140);
  local_2998 = auVar90._0_8_;
  palStack_2990 = auVar90._8_8_;
  auVar99 = paddsw(auVar92,auVar90);
  auVar90 = psubsw(auVar92,auVar90);
  local_2978 = auVar91._0_8_;
  iStack_2981 = auVar89[7];
  lStack_2980 = auVar89._8_8_;
  auVar92 = psubsw(auVar91,auVar89);
  auVar89 = paddsw(auVar91,auVar89);
  local_1c38 = auVar98._0_2_;
  uStack_1c36 = auVar98._2_2_;
  uStack_1c34 = auVar98._4_2_;
  uStack_1c32 = auVar98._6_2_;
  local_1c48 = auVar95._0_2_;
  uStack_1c46 = auVar95._2_2_;
  uStack_1c44 = auVar95._4_2_;
  uStack_1c42 = auVar95._6_2_;
  uStack_1b90 = auVar98._8_2_;
  uStack_1b8e = auVar98._10_2_;
  uStack_1b8c = auVar98._12_2_;
  uStack_1b8a = auVar98._14_2_;
  uStack_1ba0 = auVar95._8_2_;
  uStack_1b9e = auVar95._10_2_;
  uStack_1b9c = auVar95._12_2_;
  uStack_1b9a = auVar95._14_2_;
  auVar53._2_2_ = local_1c48;
  auVar53._0_2_ = local_1c38;
  auVar53._4_2_ = uStack_1c36;
  auVar53._6_2_ = uStack_1c46;
  auVar53._10_2_ = uStack_1c44;
  auVar53._8_2_ = uStack_1c34;
  auVar53._12_2_ = uStack_1c32;
  auVar53._14_2_ = uStack_1c42;
  auVar52._8_8_ = uVar77;
  auVar52._0_8_ = uVar76;
  auVar91 = pmaddwd(auVar53,auVar52);
  auVar51._2_2_ = uStack_1ba0;
  auVar51._0_2_ = uStack_1b90;
  auVar51._4_2_ = uStack_1b8e;
  auVar51._6_2_ = uStack_1b9e;
  auVar51._10_2_ = uStack_1b9c;
  auVar51._8_2_ = uStack_1b8c;
  auVar51._12_2_ = uStack_1b8a;
  auVar51._14_2_ = uStack_1b9a;
  auVar50._8_8_ = uVar77;
  auVar50._0_8_ = uVar76;
  auVar95 = pmaddwd(auVar51,auVar50);
  auVar49._2_2_ = local_1c48;
  auVar49._0_2_ = local_1c38;
  auVar49._4_2_ = uStack_1c36;
  auVar49._6_2_ = uStack_1c46;
  auVar49._10_2_ = uStack_1c44;
  auVar49._8_2_ = uStack_1c34;
  auVar49._12_2_ = uStack_1c32;
  auVar49._14_2_ = uStack_1c42;
  auVar48._8_8_ = CONCAT44(uVar83,uVar83);
  auVar48._0_8_ = CONCAT44(uVar83,uVar83);
  auVar98 = pmaddwd(auVar49,auVar48);
  auVar47._2_2_ = uStack_1ba0;
  auVar47._0_2_ = uStack_1b90;
  auVar47._4_2_ = uStack_1b8e;
  auVar47._6_2_ = uStack_1b9e;
  auVar47._10_2_ = uStack_1b9c;
  auVar47._8_2_ = uStack_1b8c;
  auVar47._12_2_ = uStack_1b8a;
  auVar47._14_2_ = uStack_1b9a;
  auVar46._8_8_ = CONCAT44(uVar83,uVar83);
  auVar46._0_8_ = CONCAT44(uVar83,uVar83);
  auVar135 = pmaddwd(auVar47,auVar46);
  local_1698 = auVar91._0_4_;
  iStack_1694 = auVar91._4_4_;
  iStack_1690 = auVar91._8_4_;
  iStack_168c = auVar91._12_4_;
  local_16b8 = auVar95._0_4_;
  iStack_16b4 = auVar95._4_4_;
  iStack_16b0 = auVar95._8_4_;
  iStack_16ac = auVar95._12_4_;
  local_16d8 = auVar98._0_4_;
  iStack_16d4 = auVar98._4_4_;
  iStack_16d0 = auVar98._8_4_;
  iStack_16cc = auVar98._12_4_;
  local_16f8 = auVar135._0_4_;
  iStack_16f4 = auVar135._4_4_;
  iStack_16f0 = auVar135._8_4_;
  iStack_16ec = auVar135._12_4_;
  auVar91 = ZEXT416(0xc);
  auVar95 = ZEXT416(0xc);
  auVar98 = ZEXT416(0xc);
  iVar87 = local_16d8 + 0x800 >> auVar98;
  iVar141 = iStack_16d4 + 0x800 >> auVar98;
  auVar135 = ZEXT416(0xc);
  iVar88 = local_16f8 + 0x800 >> auVar135;
  iVar142 = iStack_16f4 + 0x800 >> auVar135;
  iVar143 = iStack_16f0 + 0x800 >> auVar135;
  iVar144 = iStack_16ec + 0x800 >> auVar135;
  auVar73._4_4_ = iStack_1694 + 0x800 >> auVar91;
  auVar73._0_4_ = local_1698 + 0x800 >> auVar91;
  auVar73._12_4_ = iStack_168c + 0x800 >> auVar91;
  auVar73._8_4_ = iStack_1690 + 0x800 >> auVar91;
  auVar72._4_4_ = iStack_16b4 + 0x800 >> auVar95;
  auVar72._0_4_ = local_16b8 + 0x800 >> auVar95;
  auVar72._12_4_ = iStack_16ac + 0x800 >> auVar95;
  auVar72._8_4_ = iStack_16b0 + 0x800 >> auVar95;
  auVar91 = packssdw(auVar73,auVar72);
  auVar71._4_4_ = iVar141;
  auVar71._0_4_ = iVar87;
  auVar71._12_4_ = iStack_16cc + 0x800 >> auVar98;
  auVar71._8_4_ = iStack_16d0 + 0x800 >> auVar98;
  auVar70._4_4_ = iVar142;
  auVar70._0_4_ = iVar88;
  auVar70._12_4_ = iVar144;
  auVar70._8_4_ = iVar143;
  auVar95 = packssdw(auVar71,auVar70);
  local_1c58 = auVar100._0_2_;
  uStack_1c56 = auVar100._2_2_;
  uStack_1c54 = auVar100._4_2_;
  uStack_1c52 = auVar100._6_2_;
  local_1c68 = auVar93._0_2_;
  uStack_1c64 = auVar93._4_2_;
  uStack_1c62 = auVar93._6_2_;
  uStack_3492 = auVar93[2];
  iVar146 = auVar93[3];
  uStack_1bb0 = auVar100._8_2_;
  uStack_1bae = auVar100._10_2_;
  uStack_1bac = auVar100._12_2_;
  uStack_1baa = auVar100._14_2_;
  uStack_1bc0 = auVar93._8_2_;
  uStack_1bbe = auVar93._10_2_;
  uStack_1bbc = auVar93._12_2_;
  uStack_1bba = auVar93._14_2_;
  auVar45._2_2_ = local_1c68;
  auVar45._0_2_ = local_1c58;
  auVar45._4_2_ = uStack_1c56;
  auVar45[6] = uStack_3492;
  auVar45[7] = iVar146;
  auVar45._10_2_ = uStack_1c64;
  auVar45._8_2_ = uStack_1c54;
  auVar45._12_2_ = uStack_1c52;
  auVar45._14_2_ = uStack_1c62;
  auVar44._8_8_ = CONCAT44(iVar84,iVar84);
  auVar44._0_8_ = CONCAT44(iVar84,iVar84);
  auVar93 = pmaddwd(auVar45,auVar44);
  auVar43._2_2_ = uStack_1bc0;
  auVar43._0_2_ = uStack_1bb0;
  auVar43._4_2_ = uStack_1bae;
  auVar43._6_2_ = uStack_1bbe;
  auVar43._10_2_ = uStack_1bbc;
  auVar43._8_2_ = uStack_1bac;
  auVar43._12_2_ = uStack_1baa;
  auVar43._14_2_ = uStack_1bba;
  auVar42._8_8_ = CONCAT44(iVar84,iVar84);
  auVar42._0_8_ = CONCAT44(iVar84,iVar84);
  auVar98 = pmaddwd(auVar43,auVar42);
  auVar41._2_2_ = local_1c68;
  auVar41._0_2_ = local_1c58;
  auVar41._4_2_ = uStack_1c56;
  auVar41[6] = uStack_3492;
  auVar41[7] = iVar146;
  auVar41._10_2_ = uStack_1c64;
  auVar41._8_2_ = uStack_1c54;
  auVar41._12_2_ = uStack_1c52;
  auVar41._14_2_ = uStack_1c62;
  auVar40._8_8_ = uVar77;
  auVar40._0_8_ = uVar76;
  auVar100 = pmaddwd(auVar41,auVar40);
  auVar39._2_2_ = uStack_1bc0;
  auVar39._0_2_ = uStack_1bb0;
  auVar39._4_2_ = uStack_1bae;
  auVar39._6_2_ = uStack_1bbe;
  auVar39._10_2_ = uStack_1bbc;
  auVar39._8_2_ = uStack_1bac;
  auVar39._12_2_ = uStack_1baa;
  auVar39._14_2_ = uStack_1bba;
  auVar38._8_8_ = uVar77;
  auVar38._0_8_ = uVar76;
  auVar135 = pmaddwd(auVar39,auVar38);
  local_1718 = auVar93._0_4_;
  iStack_1714 = auVar93._4_4_;
  iStack_1710 = auVar93._8_4_;
  iStack_170c = auVar93._12_4_;
  local_1738 = auVar98._0_4_;
  iStack_1734 = auVar98._4_4_;
  iStack_1730 = auVar98._8_4_;
  iStack_172c = auVar98._12_4_;
  local_1758 = auVar100._0_4_;
  iStack_1754 = auVar100._4_4_;
  iStack_1750 = auVar100._8_4_;
  iStack_174c = auVar100._12_4_;
  local_1778 = auVar135._0_4_;
  iStack_1774 = auVar135._4_4_;
  iStack_1770 = auVar135._8_4_;
  iStack_176c = auVar135._12_4_;
  auVar93 = ZEXT416(0xc);
  auVar98 = ZEXT416(0xc);
  auVar100 = ZEXT416(0xc);
  auVar135 = ZEXT416(0xc);
  auVar69._4_4_ = iStack_1714 + 0x800 >> auVar93;
  auVar69._0_4_ = local_1718 + 0x800 >> auVar93;
  auVar69._12_4_ = iStack_170c + 0x800 >> auVar93;
  auVar69._8_4_ = iStack_1710 + 0x800 >> auVar93;
  auVar68._4_4_ = iStack_1734 + 0x800 >> auVar98;
  auVar68._0_4_ = local_1738 + 0x800 >> auVar98;
  auVar68._12_4_ = iStack_172c + 0x800 >> auVar98;
  auVar68._8_4_ = iStack_1730 + 0x800 >> auVar98;
  auVar93 = packssdw(auVar69,auVar68);
  auVar67._4_4_ = iStack_1754 + 0x800 >> auVar100;
  auVar67._0_4_ = local_1758 + 0x800 >> auVar100;
  auVar67._12_4_ = iStack_174c + 0x800 >> auVar100;
  auVar67._8_4_ = iStack_1750 + 0x800 >> auVar100;
  auVar66._4_4_ = iStack_1774 + 0x800 >> auVar135;
  auVar66._0_4_ = local_1778 + 0x800 >> auVar135;
  auVar66._12_4_ = iStack_176c + 0x800 >> auVar135;
  auVar66._8_4_ = iStack_1770 + 0x800 >> auVar135;
  auVar98 = packssdw(auVar67,auVar66);
  __rounding_00[1] = in_stack_ffffffffffffc748;
  __rounding_00[0] = in_stack_ffffffffffffc740;
  idct64_stage6_high48_sse2
            (in_stack_ffffffffffffc758,in_stack_ffffffffffffc750,__rounding_00,
             in_stack_ffffffffffffc73f);
  auVar100 = paddsw(auVar137,auVar140);
  auVar140 = psubsw(auVar137,auVar140);
  auVar137 = paddsw(auVar138,auVar139);
  auVar139 = psubsw(auVar138,auVar139);
  local_1c78 = auVar90._0_2_;
  uStack_1c76 = auVar90._2_2_;
  uStack_1c74 = auVar90._4_2_;
  uStack_1c72 = auVar90._6_2_;
  local_1c88 = auVar92._0_2_;
  uStack_1c86 = auVar92._2_2_;
  uStack_1c84 = auVar92._4_2_;
  uStack_1c82 = auVar92._6_2_;
  uStack_1bd0 = auVar90._8_2_;
  uStack_1bce = auVar90._10_2_;
  uStack_1bcc = auVar90._12_2_;
  uStack_1bca = auVar90._14_2_;
  uStack_1be0 = auVar92._8_2_;
  uStack_1bde = auVar92._10_2_;
  uStack_1bdc = auVar92._12_2_;
  uStack_1bda = auVar92._14_2_;
  auVar37._2_2_ = local_1c88;
  auVar37._0_2_ = local_1c78;
  auVar37._4_2_ = uStack_1c76;
  auVar37._6_2_ = uStack_1c86;
  auVar37._10_2_ = uStack_1c84;
  auVar37._8_2_ = uStack_1c74;
  auVar37._12_2_ = uStack_1c72;
  auVar37._14_2_ = uStack_1c82;
  auVar36._8_8_ = uVar79;
  auVar36._0_8_ = uVar78;
  auVar138 = pmaddwd(auVar37,auVar36);
  auVar35._2_2_ = uStack_1be0;
  auVar35._0_2_ = uStack_1bd0;
  auVar35._4_2_ = uStack_1bce;
  auVar35._6_2_ = uStack_1bde;
  auVar35._10_2_ = uStack_1bdc;
  auVar35._8_2_ = uStack_1bcc;
  auVar35._12_2_ = uStack_1bca;
  auVar35._14_2_ = uStack_1bda;
  auVar34._8_8_ = uVar79;
  auVar34._0_8_ = uVar78;
  auVar90 = pmaddwd(auVar35,auVar34);
  auVar33._2_2_ = local_1c88;
  auVar33._0_2_ = local_1c78;
  auVar33._4_2_ = uStack_1c76;
  auVar33._6_2_ = uStack_1c86;
  auVar33._10_2_ = uStack_1c84;
  auVar33._8_2_ = uStack_1c74;
  auVar33._12_2_ = uStack_1c72;
  auVar33._14_2_ = uStack_1c82;
  auVar32._8_8_ = uVar75;
  auVar32._0_8_ = uVar74;
  auVar92 = pmaddwd(auVar33,auVar32);
  auVar31._2_2_ = uStack_1be0;
  auVar31._0_2_ = uStack_1bd0;
  auVar31._4_2_ = uStack_1bce;
  auVar31._6_2_ = uStack_1bde;
  auVar31._10_2_ = uStack_1bdc;
  auVar31._8_2_ = uStack_1bcc;
  auVar31._12_2_ = uStack_1bca;
  auVar31._14_2_ = uStack_1bda;
  auVar30._8_8_ = uVar75;
  auVar30._0_8_ = uVar74;
  auVar135 = pmaddwd(auVar31,auVar30);
  local_1798 = auVar138._0_4_;
  iStack_1794 = auVar138._4_4_;
  iStack_1790 = auVar138._8_4_;
  iStack_178c = auVar138._12_4_;
  local_17b8 = auVar90._0_4_;
  iStack_17b4 = auVar90._4_4_;
  iStack_17b0 = auVar90._8_4_;
  iStack_17ac = auVar90._12_4_;
  local_17d8 = auVar92._0_4_;
  iStack_17d4 = auVar92._4_4_;
  iStack_17d0 = auVar92._8_4_;
  iStack_17cc = auVar92._12_4_;
  local_17f8 = auVar135._0_4_;
  iStack_17f4 = auVar135._4_4_;
  iStack_17f0 = auVar135._8_4_;
  iStack_17ec = auVar135._12_4_;
  local_17f8 = local_17f8 + 0x800;
  iStack_17f4 = iStack_17f4 + 0x800;
  auVar138 = ZEXT416(0xc);
  iVar84 = iStack_1790 + 0x800 >> auVar138;
  iVar145 = iStack_178c + 0x800 >> auVar138;
  auVar90 = ZEXT416(0xc);
  auVar92 = ZEXT416(0xc);
  auVar135 = ZEXT416(0xc);
  auVar65._4_4_ = iStack_1794 + 0x800 >> auVar138;
  auVar65._0_4_ = local_1798 + 0x800 >> auVar138;
  auVar65._12_4_ = iVar145;
  auVar65._8_4_ = iVar84;
  auVar64._4_4_ = iStack_17b4 + 0x800 >> auVar90;
  auVar64._0_4_ = local_17b8 + 0x800 >> auVar90;
  auVar64._12_4_ = iStack_17ac + 0x800 >> auVar90;
  auVar64._8_4_ = iStack_17b0 + 0x800 >> auVar90;
  auVar138 = packssdw(auVar65,auVar64);
  auVar63._4_4_ = iStack_17d4 + 0x800 >> auVar92;
  auVar63._0_4_ = local_17d8 + 0x800 >> auVar92;
  auVar63._12_4_ = iStack_17cc + 0x800 >> auVar92;
  auVar63._8_4_ = iStack_17d0 + 0x800 >> auVar92;
  auVar62._4_4_ = iStack_17f4 >> auVar135;
  auVar62._0_4_ = local_17f8 >> auVar135;
  auVar62._12_4_ = iStack_17ec + 0x800 >> auVar135;
  auVar62._8_4_ = iStack_17f0 + 0x800 >> auVar135;
  auVar90 = packssdw(auVar63,auVar62);
  paddsw(auVar136,auVar94);
  auVar92 = psubsw(auVar136,auVar94);
  paddsw(auVar91,auVar93);
  auVar91 = psubsw(auVar91,auVar93);
  auVar93 = psubsw(auVar97,auVar96);
  paddsw(auVar97,auVar96);
  auVar94 = psubsw(auVar95,auVar98);
  paddsw(auVar95,auVar98);
  __rounding_01[0]._2_2_ = uStack_1c64;
  __rounding_01[0]._0_2_ = uStack_1c54;
  __rounding_01[0]._4_2_ = uStack_1c52;
  __rounding_01[0]._6_2_ = uStack_1c62;
  __rounding_01[1]._0_4_ = iVar88;
  __rounding_01[1]._4_4_ = iVar142;
  idct64_stage7_high48_sse2
            ((__m128i *)CONCAT44(iVar141,iVar87),(int32_t *)CONCAT44(iVar144,iVar143),__rounding_01,
             iVar146);
  paddsw(auVar100,auVar89);
  psubsw(auVar100,auVar89);
  paddsw(auVar137,auVar90);
  psubsw(auVar137,auVar90);
  paddsw(auVar139,auVar138);
  psubsw(auVar139,auVar138);
  paddsw(auVar140,auVar99);
  psubsw(auVar140,auVar99);
  local_1c98 = auVar91._0_2_;
  uStack_1c96 = auVar91._2_2_;
  uStack_1c94 = auVar91._4_2_;
  uStack_1c92 = auVar91._6_2_;
  local_1ca8 = auVar94._0_2_;
  uStack_1ca6 = auVar94._2_2_;
  uStack_1ca4 = auVar94._4_2_;
  uStack_1ca2 = auVar94._6_2_;
  uStack_1bf0 = auVar91._8_2_;
  uStack_1bee = auVar91._10_2_;
  uStack_1bec = auVar91._12_2_;
  uStack_1bea = auVar91._14_2_;
  uStack_1c00 = auVar94._8_2_;
  uStack_1bfe = auVar94._10_2_;
  uStack_1bfc = auVar94._12_2_;
  uStack_1bfa = auVar94._14_2_;
  auVar29._2_2_ = local_1ca8;
  auVar29._0_2_ = local_1c98;
  auVar29._4_2_ = uStack_1c96;
  auVar29._6_2_ = uStack_1ca6;
  auVar29._10_2_ = uStack_1ca4;
  auVar29._8_2_ = uStack_1c94;
  auVar29._12_2_ = uStack_1c92;
  auVar29._14_2_ = uStack_1ca2;
  auVar28._8_8_ = uVar79;
  auVar28._0_8_ = uVar78;
  auVar140 = pmaddwd(auVar29,auVar28);
  auVar27._2_2_ = uStack_1c00;
  auVar27._0_2_ = uStack_1bf0;
  auVar27._4_2_ = uStack_1bee;
  auVar27._6_2_ = uStack_1bfe;
  auVar27._10_2_ = uStack_1bfc;
  auVar27._8_2_ = uStack_1bec;
  auVar27._12_2_ = uStack_1bea;
  auVar27._14_2_ = uStack_1bfa;
  auVar26._8_8_ = uVar79;
  auVar26._0_8_ = uVar78;
  auVar139 = pmaddwd(auVar27,auVar26);
  auVar25._2_2_ = local_1ca8;
  auVar25._0_2_ = local_1c98;
  auVar25._4_2_ = uStack_1c96;
  auVar25._6_2_ = uStack_1ca6;
  auVar25._10_2_ = uStack_1ca4;
  auVar25._8_2_ = uStack_1c94;
  auVar25._12_2_ = uStack_1c92;
  auVar25._14_2_ = uStack_1ca2;
  auVar24._8_8_ = uVar75;
  auVar24._0_8_ = uVar74;
  auVar138 = pmaddwd(auVar25,auVar24);
  auVar23._2_2_ = uStack_1c00;
  auVar23._0_2_ = uStack_1bf0;
  auVar23._4_2_ = uStack_1bee;
  auVar23._6_2_ = uStack_1bfe;
  auVar23._10_2_ = uStack_1bfc;
  auVar23._8_2_ = uStack_1bec;
  auVar23._12_2_ = uStack_1bea;
  auVar23._14_2_ = uStack_1bfa;
  auVar22._8_8_ = uVar75;
  auVar22._0_8_ = uVar74;
  auVar137 = pmaddwd(auVar23,auVar22);
  local_1818 = auVar140._0_4_;
  iStack_1814 = auVar140._4_4_;
  iStack_1810 = auVar140._8_4_;
  iStack_180c = auVar140._12_4_;
  local_1838 = auVar139._0_4_;
  iStack_1834 = auVar139._4_4_;
  iStack_1830 = auVar139._8_4_;
  iStack_182c = auVar139._12_4_;
  local_1858 = auVar138._0_4_;
  iStack_1854 = auVar138._4_4_;
  iStack_1850 = auVar138._8_4_;
  iStack_184c = auVar138._12_4_;
  local_1878 = auVar137._0_4_;
  iStack_1874 = auVar137._4_4_;
  iStack_1870 = auVar137._8_4_;
  iStack_186c = auVar137._12_4_;
  auVar140 = ZEXT416(0xc);
  auVar139 = ZEXT416(0xc);
  auVar138 = ZEXT416(0xc);
  auVar137 = ZEXT416(0xc);
  auVar61._4_4_ = iStack_1814 + 0x800 >> auVar140;
  auVar61._0_4_ = local_1818 + 0x800 >> auVar140;
  auVar61._12_4_ = iStack_180c + 0x800 >> auVar140;
  auVar61._8_4_ = iStack_1810 + 0x800 >> auVar140;
  auVar60._4_4_ = iStack_1834 + 0x800 >> auVar139;
  auVar60._0_4_ = local_1838 + 0x800 >> auVar139;
  auVar60._12_4_ = iStack_182c + 0x800 >> auVar139;
  auVar60._8_4_ = iStack_1830 + 0x800 >> auVar139;
  packssdw(auVar61,auVar60);
  auVar59._4_4_ = iStack_1854 + 0x800 >> auVar138;
  auVar59._0_4_ = local_1858 + 0x800 >> auVar138;
  auVar59._12_4_ = iStack_184c + 0x800 >> auVar138;
  auVar59._8_4_ = iStack_1850 + 0x800 >> auVar138;
  auVar58._4_4_ = iStack_1874 + 0x800 >> auVar137;
  auVar58._0_4_ = local_1878 + 0x800 >> auVar137;
  auVar58._12_4_ = iStack_186c + 0x800 >> auVar137;
  auVar58._8_4_ = iStack_1870 + 0x800 >> auVar137;
  packssdw(auVar59,auVar58);
  local_1cb8 = auVar92._0_2_;
  uStack_1cb6 = auVar92._2_2_;
  uStack_1cb4 = auVar92._4_2_;
  uStack_1cb2 = auVar92._6_2_;
  local_1cc8 = auVar93._0_2_;
  uStack_1cc6 = auVar93._2_2_;
  uStack_1cc4 = auVar93._4_2_;
  uStack_1cc2 = auVar93._6_2_;
  uStack_1c10 = auVar92._8_2_;
  uStack_1c0e = auVar92._10_2_;
  uStack_1c0c = auVar92._12_2_;
  uStack_1c0a = auVar92._14_2_;
  uStack_1c20 = auVar93._8_2_;
  uStack_1c1e = auVar93._10_2_;
  uStack_1c1c = auVar93._12_2_;
  uStack_1c1a = auVar93._14_2_;
  auVar21._2_2_ = local_1cc8;
  auVar21._0_2_ = local_1cb8;
  auVar21._4_2_ = uStack_1cb6;
  auVar21._6_2_ = uStack_1cc6;
  auVar21._10_2_ = uStack_1cc4;
  auVar21._8_2_ = uStack_1cb4;
  auVar21._12_2_ = uStack_1cb2;
  auVar21._14_2_ = uStack_1cc2;
  auVar20._8_8_ = uVar79;
  auVar20._0_8_ = uVar78;
  auVar140 = pmaddwd(auVar21,auVar20);
  auVar19._2_2_ = uStack_1c20;
  auVar19._0_2_ = uStack_1c10;
  auVar19._4_2_ = uStack_1c0e;
  auVar19._6_2_ = uStack_1c1e;
  auVar19._10_2_ = uStack_1c1c;
  auVar19._8_2_ = uStack_1c0c;
  auVar19._12_2_ = uStack_1c0a;
  auVar19._14_2_ = uStack_1c1a;
  auVar18._8_8_ = uVar79;
  auVar18._0_8_ = uVar78;
  auVar139 = pmaddwd(auVar19,auVar18);
  auVar17._2_2_ = local_1cc8;
  auVar17._0_2_ = local_1cb8;
  auVar17._4_2_ = uStack_1cb6;
  auVar17._6_2_ = uStack_1cc6;
  auVar17._10_2_ = uStack_1cc4;
  auVar17._8_2_ = uStack_1cb4;
  auVar17._12_2_ = uStack_1cb2;
  auVar17._14_2_ = uStack_1cc2;
  auVar16._8_8_ = uVar75;
  auVar16._0_8_ = uVar74;
  auVar138 = pmaddwd(auVar17,auVar16);
  auVar15._2_2_ = uStack_1c20;
  auVar15._0_2_ = uStack_1c10;
  auVar15._4_2_ = uStack_1c0e;
  auVar15._6_2_ = uStack_1c1e;
  auVar15._10_2_ = uStack_1c1c;
  auVar15._8_2_ = uStack_1c0c;
  auVar15._12_2_ = uStack_1c0a;
  auVar15._14_2_ = uStack_1c1a;
  auVar14._8_8_ = uVar75;
  auVar14._0_8_ = uVar74;
  auVar137 = pmaddwd(auVar15,auVar14);
  local_1898 = auVar140._0_4_;
  iStack_1894 = auVar140._4_4_;
  iStack_1890 = auVar140._8_4_;
  iStack_188c = auVar140._12_4_;
  local_18b8 = auVar139._0_4_;
  iStack_18b4 = auVar139._4_4_;
  iStack_18b0 = auVar139._8_4_;
  iStack_18ac = auVar139._12_4_;
  local_18d8 = auVar138._0_4_;
  iStack_18d4 = auVar138._4_4_;
  iStack_18d0 = auVar138._8_4_;
  iStack_18cc = auVar138._12_4_;
  local_18f8 = auVar137._0_4_;
  iStack_18f4 = auVar137._4_4_;
  iStack_18f0 = auVar137._8_4_;
  iStack_18ec = auVar137._12_4_;
  auVar140 = ZEXT416(0xc);
  auVar139 = ZEXT416(0xc);
  auVar138 = ZEXT416(0xc);
  auVar137 = ZEXT416(0xc);
  auVar57._4_4_ = iStack_1894 + 0x800 >> auVar140;
  auVar57._0_4_ = local_1898 + 0x800 >> auVar140;
  auVar57._12_4_ = iStack_188c + 0x800 >> auVar140;
  auVar57._8_4_ = iStack_1890 + 0x800 >> auVar140;
  auVar56._4_4_ = iStack_18b4 + 0x800 >> auVar139;
  auVar56._0_4_ = local_18b8 + 0x800 >> auVar139;
  auVar56._12_4_ = iStack_18ac + 0x800 >> auVar139;
  auVar56._8_4_ = iStack_18b0 + 0x800 >> auVar139;
  packssdw(auVar57,auVar56);
  auVar55._4_4_ = iStack_18d4 + 0x800 >> auVar138;
  auVar55._0_4_ = local_18d8 + 0x800 >> auVar138;
  auVar55._12_4_ = iStack_18cc + 0x800 >> auVar138;
  auVar55._8_4_ = iStack_18d0 + 0x800 >> auVar138;
  auVar54._4_4_ = iStack_18f4 + 0x800 >> auVar137;
  auVar54._0_4_ = local_18f8 + 0x800 >> auVar137;
  auVar54._12_4_ = iStack_18ec + 0x800 >> auVar137;
  auVar54._8_4_ = iStack_18f0 + 0x800 >> auVar137;
  packssdw(auVar55,auVar54);
  __rounding_05[1] = local_2818;
  __rounding_05[0] = lStack_27f0;
  idct64_stage8_high48_sse2(local_2828,piStack_2810,__rounding_05,iStack_27f1);
  __rounding_03[1] = local_2978;
  __rounding_03[0] = lStack_2980;
  idct64_stage9_sse2(palStack_2990,local_2998,__rounding_03,iStack_2981);
  __rounding_06[1] = lVar148;
  __rounding_06[0] = lVar147;
  idct64_stage10_sse2(x_00,cospi_00,__rounding_06,cos_bit_01);
  idct64_stage11_sse2((__m128i *)CONCAT44(iStack_17f4,local_17f8),
                      (__m128i *)CONCAT44(iVar145,iVar84));
  return;
}

Assistant:

static void idct64_low32_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[64];
  x[0] = input[0];
  x[2] = input[16];
  x[4] = input[8];
  x[6] = input[24];
  x[8] = input[4];
  x[10] = input[20];
  x[12] = input[12];
  x[14] = input[28];
  x[16] = input[2];
  x[18] = input[18];
  x[20] = input[10];
  x[22] = input[26];
  x[24] = input[6];
  x[26] = input[22];
  x[28] = input[14];
  x[30] = input[30];
  x[32] = input[1];
  x[34] = input[17];
  x[36] = input[9];
  x[38] = input[25];
  x[40] = input[5];
  x[42] = input[21];
  x[44] = input[13];
  x[46] = input[29];
  x[48] = input[3];
  x[50] = input[19];
  x[52] = input[11];
  x[54] = input[27];
  x[56] = input[7];
  x[58] = input[23];
  x[60] = input[15];
  x[62] = input[31];

  // stage 2
  btf_16_ssse3(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_ssse3(-cospi[33], cospi[31], x[62], x[33], x[62]);
  btf_16_ssse3(cospi[47], cospi[17], x[34], x[34], x[61]);
  btf_16_ssse3(-cospi[49], cospi[15], x[60], x[35], x[60]);
  btf_16_ssse3(cospi[55], cospi[9], x[36], x[36], x[59]);
  btf_16_ssse3(-cospi[41], cospi[23], x[58], x[37], x[58]);
  btf_16_ssse3(cospi[39], cospi[25], x[38], x[38], x[57]);
  btf_16_ssse3(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_ssse3(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_ssse3(-cospi[37], cospi[27], x[54], x[41], x[54]);
  btf_16_ssse3(cospi[43], cospi[21], x[42], x[42], x[53]);
  btf_16_ssse3(-cospi[53], cospi[11], x[52], x[43], x[52]);
  btf_16_ssse3(cospi[51], cospi[13], x[44], x[44], x[51]);
  btf_16_ssse3(-cospi[45], cospi[19], x[50], x[45], x[50]);
  btf_16_ssse3(cospi[35], cospi[29], x[46], x[46], x[49]);
  btf_16_ssse3(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_ssse3(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_ssse3(-cospi[34], cospi[30], x[30], x[17], x[30]);
  btf_16_ssse3(cospi[46], cospi[18], x[18], x[18], x[29]);
  btf_16_ssse3(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_ssse3(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_ssse3(-cospi[42], cospi[22], x[26], x[21], x[26]);
  btf_16_ssse3(cospi[38], cospi[26], x[22], x[22], x[25]);
  btf_16_ssse3(-cospi[58], cospi[6], x[24], x[23], x[24]);
  btf_16_adds_subs_sse2(x[32], x[33]);
  btf_16_subs_adds_sse2(x[35], x[34]);
  btf_16_adds_subs_sse2(x[36], x[37]);
  btf_16_subs_adds_sse2(x[39], x[38]);
  btf_16_adds_subs_sse2(x[40], x[41]);
  btf_16_subs_adds_sse2(x[43], x[42]);
  btf_16_adds_subs_sse2(x[44], x[45]);
  btf_16_subs_adds_sse2(x[47], x[46]);
  btf_16_adds_subs_sse2(x[48], x[49]);
  btf_16_subs_adds_sse2(x[51], x[50]);
  btf_16_adds_subs_sse2(x[52], x[53]);
  btf_16_subs_adds_sse2(x[55], x[54]);
  btf_16_adds_subs_sse2(x[56], x[57]);
  btf_16_subs_adds_sse2(x[59], x[58]);
  btf_16_adds_subs_sse2(x[60], x[61]);
  btf_16_subs_adds_sse2(x[63], x[62]);

  // stage 4
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_ssse3(-cospi[36], cospi[28], x[14], x[9], x[14]);
  btf_16_ssse3(cospi[44], cospi[20], x[10], x[10], x[13]);
  btf_16_ssse3(-cospi[52], cospi[12], x[12], x[11], x[12]);
  btf_16_adds_subs_sse2(x[16], x[17]);
  btf_16_subs_adds_sse2(x[19], x[18]);
  btf_16_adds_subs_sse2(x[20], x[21]);
  btf_16_subs_adds_sse2(x[23], x[22]);
  btf_16_adds_subs_sse2(x[24], x[25]);
  btf_16_subs_adds_sse2(x[27], x[26]);
  btf_16_adds_subs_sse2(x[28], x[29]);
  btf_16_subs_adds_sse2(x[31], x[30]);
  idct64_stage4_high32_sse2(x, cospi, __rounding, cos_bit);

  // stage 5
  btf_16_ssse3(cospi[56], cospi[8], x[4], x[4], x[7]);
  btf_16_ssse3(-cospi[40], cospi[24], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);
  idct64_stage5_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 6
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_ssse3(cospi[48], cospi[16], x[2], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);
  idct64_stage6_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 7
  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[11]);
  btf_16_adds_subs_sse2(x[9], x[10]);
  btf_16_subs_adds_sse2(x[15], x[12]);
  btf_16_subs_adds_sse2(x[14], x[13]);
  idct64_stage7_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 8
  btf_16_adds_subs_sse2(x[0], x[7]);
  btf_16_adds_subs_sse2(x[1], x[6]);
  btf_16_adds_subs_sse2(x[2], x[5]);
  btf_16_adds_subs_sse2(x[3], x[4]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);
  idct64_stage8_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 9~11
  idct64_stage9_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage10_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage11_sse2(output, x);
}